

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

void compact_monsters(chunk *c,wchar_t num_to_compact)

{
  loc_conflict grid;
  _Bool _Var1;
  int iVar2;
  wchar_t wVar3;
  uint32_t uVar4;
  monster_conflict *pmVar5;
  monster *mon_1;
  monster *mon;
  wchar_t chance;
  wchar_t min_dis;
  wchar_t max_lev;
  wchar_t iter;
  wchar_t num_compacted;
  wchar_t m_idx;
  wchar_t num_to_compact_local;
  chunk *c_local;
  
  if (num_to_compact != L'\0') {
    msg("Compacting monsters...");
  }
  max_lev = L'\0';
  min_dis = L'\x01';
  while (max_lev < num_to_compact) {
    iVar2 = (0x14 - min_dis) * 5;
    for (iter = L'\x01'; wVar3 = cave_monster_max((chunk_conflict *)c), iter < wVar3;
        iter = iter + L'\x01') {
      pmVar5 = cave_monster((chunk_conflict *)c,iter);
      if (((pmVar5->race != (monster_race *)0x0) && (pmVar5->race->level <= min_dis * 5)) &&
         ((iVar2 < 1 || (iVar2 <= (int)(uint)pmVar5->cdis)))) {
        mon._4_4_ = 0x5a;
        _Var1 = quest_unique_monster_check(pmVar5->race);
        if ((_Var1) && (min_dis < L'Ϩ')) {
          mon._4_4_ = 100;
        }
        _Var1 = monster_is_unique((monster *)pmVar5);
        if (_Var1) {
          mon._4_4_ = 99;
        }
        uVar4 = Rand_div(100);
        if (mon._4_4_ <= (int)uVar4) {
          grid.x = (pmVar5->grid).x;
          grid.y = (pmVar5->grid).y;
          delete_monster(c,grid);
          max_lev = max_lev + L'\x01';
        }
      }
    }
    min_dis = min_dis + L'\x01';
  }
  iter = cave_monster_max((chunk_conflict *)c);
  while (iter = iter + L'\xffffffff', L'\0' < iter) {
    pmVar5 = cave_monster((chunk_conflict *)c,iter);
    if (pmVar5->race == (monster_race *)0x0) {
      wVar3 = cave_monster_max((chunk_conflict *)c);
      monster_index_move(c,wVar3 + L'\xffffffff',iter);
      c->mon_max = c->mon_max - 1;
    }
  }
  return;
}

Assistant:

void compact_monsters(struct chunk *c, int num_to_compact)
{
	int m_idx, num_compacted, iter;

	int max_lev, min_dis, chance;


	/* Message (only if compacting) */
	if (num_to_compact)
		msg("Compacting monsters...");


	/* Compact at least 'num_to_compact' objects */
	for (num_compacted = 0, iter = 1; num_compacted < num_to_compact; iter++) {
		/* Get more vicious each iteration */
		max_lev = 5 * iter;

		/* Get closer each iteration */
		min_dis = 5 * (20 - iter);

		/* Check all the monsters */
		for (m_idx = 1; m_idx < cave_monster_max(c); m_idx++) {
			struct monster *mon = cave_monster(c, m_idx);

			/* Skip "dead" monsters */
			if (!mon->race) continue;

			/* High level monsters start out "immune" */
			if (mon->race->level > max_lev) continue;

			/* Ignore nearby monsters */
			if ((min_dis > 0) && (mon->cdis < min_dis)) continue;

			/* Saving throw chance */
			chance = 90;

			/* Only compact "Quest" Monsters in emergencies */
			if (quest_unique_monster_check(mon->race) && (iter < 1000))
				chance = 100;

			/* Try not to compact Unique Monsters */
			if (monster_is_unique(mon)) chance = 99;

			/* All monsters get a saving throw */
			if (randint0(100) < chance) continue;

			/* Delete the monster */
			delete_monster(c, mon->grid);

			/* Count the monster */
			num_compacted++;
		}
	}


	/* Excise dead monsters (backwards!) */
	for (m_idx = cave_monster_max(c) - 1; m_idx >= 1; m_idx--) {
		struct monster *mon = cave_monster(c, m_idx);

		/* Skip real monsters */
		if (mon->race) continue;

		/* Move last monster into open hole */
		monster_index_move(c, cave_monster_max(c) - 1, m_idx);

		/* Compress "c->mon_max" */
		c->mon_max--;
	}
}